

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

_variable_type __thiscall
gl4cts::FunctionObject::unaryWithOutputByComponent<double,_double,_double>::getResultType
          (unaryWithOutputByComponent<double,_double,_double> *this,GLuint result)

{
  TestError *this_00;
  _variable_type local_18;
  _variable_type type;
  GLuint result_local;
  unaryWithOutputByComponent<double,_double,_double> *this_local;
  
  if (result == 0) {
    local_18 = (this->super_unaryBase).super_functionObject.m_res_type;
  }
  else {
    if (result != 1) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x307f);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_18 = this->m_out_type;
  }
  return local_18;
}

Assistant:

Utils::_variable_type getResultType(glw::GLuint result) const
	{
		Utils::_variable_type type = Utils::VARIABLE_TYPE_UNKNOWN;

		switch (result)
		{
		case 0:
			type = m_res_type;
			break;
		case 1:
			type = m_out_type;
			break;
		default:
			TCU_FAIL("Not implemented");
			break;
		}

		return type;
	}